

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5DoclistIterNext(Fts5DoclistIter *pIter)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uchar *p;
  int nPos;
  i64 iDelta;
  
  p = pIter->aPoslist + (long)pIter->nPoslist + (long)pIter->nSize;
  if (p < pIter->aEof) {
    bVar1 = sqlite3Fts5GetVarint(p,(u64 *)&iDelta);
    pIter->iRowid = pIter->iRowid + iDelta;
    if ((char)p[bVar1] < '\0') {
      iVar2 = sqlite3Fts5GetVarint32(p + bVar1,(u32 *)&nPos);
      uVar3 = nPos >> 1;
    }
    else {
      uVar3 = (uint)(p[bVar1] >> 1);
      iVar2 = 1;
    }
    pIter->nPoslist = uVar3;
    pIter->nSize = iVar2;
    pIter->aPoslist = p + bVar1;
  }
  else {
    pIter->aPoslist = (u8 *)0x0;
  }
  return;
}

Assistant:

static void fts5DoclistIterNext(Fts5DoclistIter *pIter){
  u8 *p = pIter->aPoslist + pIter->nSize + pIter->nPoslist;

  assert( pIter->aPoslist );
  if( p>=pIter->aEof ){
    pIter->aPoslist = 0;
  }else{
    i64 iDelta;

    p += fts5GetVarint(p, (u64*)&iDelta);
    pIter->iRowid += iDelta;

    /* Read position list size */
    if( p[0] & 0x80 ){
      int nPos;
      pIter->nSize = fts5GetVarint32(p, nPos);
      pIter->nPoslist = (nPos>>1);
    }else{
      pIter->nPoslist = ((int)(p[0])) >> 1;
      pIter->nSize = 1;
    }

    pIter->aPoslist = p;
  }
}